

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O1

void henson::
     Serialization<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
     ::save(BinaryBuffer *bb,Vector *v)

{
  pointer p;
  long lVar1;
  size_t s;
  long local_28;
  
  local_28 = ((long)(v->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(v->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
  (**bb->_vptr_BinaryBuffer)(bb,&local_28,8);
  p = (v->
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      )._M_impl.super__Vector_impl_data._M_start;
  lVar1 = (long)(v->
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)p;
  if (lVar1 != 0) {
    lVar1 = (lVar1 >> 3) * -0x3333333333333333;
    do {
      Serialization<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
      ::save(bb,p);
      p = p + 1;
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  return;
}

Assistant:

static void         save(BinaryBuffer& bb, const Vector& v)
    {
      size_t s = v.size();
      henson::save(bb, s);
      henson::save(bb, &v[0], v.size());
    }